

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_ciphersuites.h
# Opt level: O0

int mbedtls_ssl_ciphersuite_cert_req_allowed(mbedtls_ssl_ciphersuite_t *info)

{
  uint uVar1;
  mbedtls_ssl_ciphersuite_t *info_local;
  
  uVar1 = (uint)info->key_exchange;
  if ((uVar1 - 1 < 4) || (uVar1 == 9 || uVar1 == 10)) {
    info_local._4_4_ = 1;
  }
  else {
    info_local._4_4_ = 0;
  }
  return info_local._4_4_;
}

Assistant:

static inline int mbedtls_ssl_ciphersuite_cert_req_allowed(const mbedtls_ssl_ciphersuite_t *info)
{
    switch (info->MBEDTLS_PRIVATE(key_exchange)) {
        case MBEDTLS_KEY_EXCHANGE_RSA:
        case MBEDTLS_KEY_EXCHANGE_DHE_RSA:
        case MBEDTLS_KEY_EXCHANGE_ECDH_RSA:
        case MBEDTLS_KEY_EXCHANGE_ECDHE_RSA:
        case MBEDTLS_KEY_EXCHANGE_ECDH_ECDSA:
        case MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA:
            return 1;

        default:
            return 0;
    }
}